

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::Append
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZFMatrix<double> *u1,TPZFMatrix<double> *u2
          ,TPZFMatrix<double> *u12)

{
  long lVar1;
  int64_t cu1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t ru1;
  
  lVar6 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar3 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  lVar5 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar1 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 == 1 && lVar3 == 1) {
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar5 + lVar6,1);
    if (0 < lVar6) {
      lVar3 = 0;
      do {
        if (((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        u12->fElem[lVar3] = u1->fElem[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
    }
    if (0 < lVar5) {
      lVar3 = 0;
      do {
        if (((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
           ((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((lVar6 < 0) || ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6)) ||
           ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        u12->fElem[lVar6] = u2->fElem[lVar3];
        lVar3 = lVar3 + 1;
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  else {
    lVar4 = lVar5;
    if (lVar5 < lVar6) {
      lVar4 = lVar6;
    }
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar4,lVar1 + lVar3);
    if (0 < lVar6) {
      lVar4 = 0;
      do {
        if (0 < lVar3) {
          lVar2 = 0;
          do {
            if (((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar4) ||
               ((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar4) ||
               ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            u12->fElem[(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar2 + lVar4] =
                 u1->fElem[(u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar2 + lVar4];
            lVar2 = lVar2 + 1;
          } while (lVar3 != lVar2);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != lVar6);
    }
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        if (0 < lVar1) {
          lVar4 = 0;
          do {
            if (((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) ||
               ((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar2 = lVar4 + lVar3;
            if ((((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar6) || (lVar2 < 0))
               || ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            u12->fElem[lVar2 * (u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + lVar6] =
                 u2->fElem[(u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar4 + lVar6];
            lVar4 = lVar4 + 1;
          } while (lVar1 != lVar4);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar5);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Append(TPZFMatrix<REAL> &u1, TPZFMatrix<REAL> &u2, TPZFMatrix<REAL> &u12)
{

	bool Is_u1PHI = (u1.Cols() == 1) ? true : false;
	bool Is_u2PHI = (u2.Cols() == 1) ? true : false;

	if(Is_u1PHI && Is_u2PHI)
	{
		int64_t nu1 = u1.Rows(),nu2 = u2.Rows();
		u12.Redim(nu1+nu2,1);
		int64_t i;
		for(i=0; i<nu1; i++) u12(i,0) = u1(i,0);
		for(i=0; i<nu2; i++) u12(i+nu1,0) = u2(i,0);


	}
	else if(!Is_u1PHI || !Is_u2PHI)
	{
		int64_t ru1 = u1.Rows(), cu1 = u1.Cols(), ru2 = u2.Rows(), cu2 = u2.Cols();
		int64_t ru12 = ru1 < ru2 ? ru2 : ru1;
		int64_t cu12 = cu1+cu2;
		u12.Redim(ru12,cu12);
		int64_t i,j;
		for(i=0; i<ru1; i++) for(j=0; j<cu1; j++) u12(i,j) = u1(i,j);
		for(i=0; i<ru2; i++) for(j=0; j<cu2; j++) u12(i,j+cu1) = u2(i,j);
	}
	else
	{
		PZError << "TPZCompElHDiv::Append. Bad input parameters " << std::endl;

	}

}